

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.h
# Opt level: O0

void __thiscall
TextFile::writeFormat<long,std::__cxx11::string>
          (TextFile *this,char *text,long *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  void *__buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined1 local_48 [8];
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  long *args_local;
  char *text_local;
  TextFile *this_local;
  
  message.field_2._8_8_ = args_1;
  tinyformat::format<long,std::__cxx11::string>
            ((string *)local_48,(tinyformat *)text,(char *)args,(long *)args_1,in_R8);
  write(this,(int)(string *)local_48,__buf,(size_t)args_1);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void writeFormat(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		write(message);
	}